

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RealDebugCounter::Register(RealDebugCounter *this,string_view name)

{
  bool bVar1;
  Map *pMVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  Nonnull<long_*> out;
  char in_R8B;
  string_view str;
  ConvertibleToStringView text;
  RealDebugCounter *local_d0;
  key_type local_c8;
  RealDebugCounter *local_b0;
  key_type local_a8;
  char *local_90;
  size_t local_88;
  long local_80;
  int64_t as_int;
  char *local_70;
  ConvertibleToStringView local_68;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  undefined1 local_40 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parts;
  RealDebugCounter *this_local;
  string_view name_local;
  
  local_70 = name._M_str;
  as_int = name._M_len;
  parts.second._M_str = (char *)this;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_68,name);
  text.value_._M_str = (char *)0x2e;
  text.value_._M_len = (size_t)local_68.value_._M_str;
  out = (Nonnull<long_*>)0x2e;
  absl::lts_20250127::StrSplit<char>(&local_58,(lts_20250127 *)local_68.value_._M_len,text,in_R8B);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_40,&local_58);
  local_90 = parts.first._M_str;
  local_88 = parts.second._M_len;
  str._M_str = (char *)&local_80;
  str._M_len = parts.second._M_len;
  bVar1 = absl::lts_20250127::SimpleAtoi<long>((lts_20250127 *)parts.first._M_str,str,out);
  if (bVar1) {
    pMVar2 = CounterMap();
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
             ::operator[](pMVar2,(key_type *)local_40);
    std::variant<long,std::basic_string_view<char,std::char_traits<char>>>::
    variant<long&,void,void,long,void>
              ((variant<long,std::basic_string_view<char,std::char_traits<char>>> *)&local_a8,
               &local_80);
    pmVar4 = std::
             map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
             ::operator[](pmVar3,&local_a8);
    local_b0 = this;
    std::
    vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
    ::push_back(pmVar4,&local_b0);
  }
  else {
    pMVar2 = CounterMap();
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
             ::operator[](pMVar2,(key_type *)local_40);
    std::variant<long,std::basic_string_view<char,std::char_traits<char>>>::
    variant<std::basic_string_view<char,std::char_traits<char>>&,void,void,std::basic_string_view<char,std::char_traits<char>>,void>
              ((variant<long,std::basic_string_view<char,std::char_traits<char>>> *)&local_c8,
               (basic_string_view<char,_std::char_traits<char>_> *)&parts.first._M_str);
    pmVar4 = std::
             map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
             ::operator[](pmVar3,&local_c8);
    local_d0 = this;
    std::
    vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
    ::push_back(pmVar4,&local_d0);
  }
  return;
}

Assistant:

void RealDebugCounter::Register(absl::string_view name) {
  std::pair<absl::string_view, absl::string_view> parts =
      absl::StrSplit(name, '.');
  int64_t as_int;
  if (absl::SimpleAtoi(parts.second, &as_int)) {
    CounterMap()[parts.first][as_int].push_back(this);
  } else {
    CounterMap()[parts.first][parts.second].push_back(this);
  }
}